

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_event_e fhndl_send(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  pcp_errno pVar1;
  pcp_server_t *s_00;
  pcp_server_t *s;
  pcp_recv_msg_t *msg_local;
  pcp_flow_t *f_local;
  
  s_00 = get_pcp_server(f->ctx,f->pcp_server_indx);
  if (s_00 == (pcp_server_t *)0x0) {
    f_local._4_4_ = fev_failed;
  }
  else if (s_00->restart_flow_msg == f) {
    f_local._4_4_ = fev_ignored;
  }
  else {
    pVar1 = pcp_flow_send_msg(f,s_00);
    if (pVar1 == PCP_ERR_SUCCESS) {
      f->resend_timeout = 3000;
      gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
      (f->timeout).tv_sec = (ulong)f->resend_timeout / 1000 + (f->timeout).tv_sec;
      (f->timeout).tv_usec = (ulong)((f->resend_timeout % 1000) * 1000) + (f->timeout).tv_usec;
      f_local._4_4_ = fev_msg_sent;
    }
    else {
      f_local._4_4_ = fev_failed;
    }
  }
  return f_local._4_4_;
}

Assistant:

static pcp_flow_event_e fhndl_send(pcp_flow_t *f, UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    if (s->restart_flow_msg == f) {
        return fev_ignored;
    }

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    f->resend_timeout = PCP_RETX_IRT;
    // set timeout field
    gettimeofday(&f->timeout, NULL);
    f->timeout.tv_sec += f->resend_timeout / 1000;
    f->timeout.tv_usec += (f->resend_timeout % 1000) * 1000;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_msg_sent;
}